

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jieba.cc
# Opt level: O2

void jieba_words_free(jieba_words_t *words)

{
  size_t i;
  ulong uVar1;
  
  for (uVar1 = 0; uVar1 < words->length; uVar1 = uVar1 + 1) {
    free(words->words[uVar1]);
  }
  free(words->words);
  free(words);
  return;
}

Assistant:

void jieba_words_free(jieba_words_t* words) {
    for (size_t i = 0; i < words->length; i++) {
        if (words->words[i] != NULL) {
            free(words->words[i]);
        }
    }
    free(words->words);
    free(words);
}